

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall
wallet::WalletBatch::WriteDescriptorParentCache
          (WalletBatch *this,CExtPubKey *xpub,uint256 *desc_id,uint32_t key_exp_index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  value_type *__val;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_unsigned_int>
  local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x4a);
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x4a;
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2c] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2d] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2e] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2f] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x30] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x31] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x32] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x33] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x34] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x35] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x36] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x37] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x38] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x39] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3a] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3b] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3c] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3d] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3e] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x3f] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x40] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x41] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x42] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x43] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x44] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x45] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x46] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x47] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x48] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x49] = '\0';
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  CExtPubKey::Encode(xpub,local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,DBKeys::WALLETDESCRIPTORCACHE_abi_cxx11_,
             DAT_00b37cb8 + DBKeys::WALLETDESCRIPTORCACHE_abi_cxx11_);
  local_98 = *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  uStack_90 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_88 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_80 = *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  paVar1 = &local_78.first.first.field_2;
  if (local_b8 == &local_a8) {
    local_78.first.first.field_2._8_8_ = local_a8._8_8_;
    local_78.first.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.first.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_78.first.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_78.first.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_78.first.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_78.first.second.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(desc_id->super_base_blob<256U>).m_data._M_elems;
  local_78.first.second.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 8);
  local_78.first.second.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_78.first.second.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((desc_id->super_base_blob<256U>).m_data._M_elems + 0x18);
  local_b8 = &local_a8;
  local_78.second = key_exp_index;
  bVar2 = WriteIC<std::pair<std::pair<std::__cxx11::string,uint256>,unsigned_int>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&local_78,&local_d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.first.first._M_dataplus._M_p,
                    local_78.first.first.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorParentCache(const CExtPubKey& xpub, const uint256& desc_id, uint32_t key_exp_index)
{
    std::vector<unsigned char> ser_xpub(BIP32_EXTKEY_SIZE);
    xpub.Encode(ser_xpub.data());
    return WriteIC(std::make_pair(std::make_pair(DBKeys::WALLETDESCRIPTORCACHE, desc_id), key_exp_index), ser_xpub);
}